

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O2

bool test(void)

{
  Type (*paTVar1) [6000];
  ostream *poVar2;
  long lVar3;
  int i;
  ulong uVar4;
  float fVar5;
  
  paTVar1 = mx;
  uVar4 = 0;
  do {
    if (uVar4 == 6000) {
LAB_0010c68e:
      return 5999 < uVar4;
    }
    fVar5 = 0.0;
    for (lVar3 = 0; lVar3 != 24000; lVar3 = lVar3 + 4) {
      fVar5 = fVar5 + *(float *)((long)*paTVar1 + lVar3) * *(float *)((long)v + lVar3);
    }
    fVar5 = fVar5 + 1.0;
    if ((fVar5 != result[uVar4]) || (NAN(fVar5) || NAN(result[uVar4]))) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error at result ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar4);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar5);
      poVar2 = std::operator<<(poVar2,"!=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,result[uVar4]);
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_0010c68e;
    }
    uVar4 = uVar4 + 1;
    paTVar1 = paTVar1 + 1;
  } while( true );
}

Assistant:

bool test()
{
  const Type *mxp = (const Type *)mx;
  const Type *vp  = (const Type *)v;
  const Type *rp  = (const Type *)result;
  
  for (int i = 0; i < M; i++) {
    Type f = (Type)0;
    for(int j = 0; j < N; j++)
      f += mxp[i * N + j] * vp[j];
    if ( (f + (Type)1) != rp[i]) {
      std::cerr << "Error at result " << i << ' ' << (f + (Type)1) << "!=" << rp[i] << std::endl;
      return false;
    }
  }
  
  return true;
}